

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O2

Msat_IntVec_t * Msat_IntVecAllocArrayCopy(int *pArray,int nSize)

{
  Msat_IntVec_t *pMVar1;
  int *__dest;
  
  pMVar1 = (Msat_IntVec_t *)malloc(0x10);
  pMVar1->nSize = nSize;
  pMVar1->nCap = nSize;
  __dest = (int *)malloc((long)nSize << 2);
  pMVar1->pArray = __dest;
  memcpy(__dest,pArray,(long)nSize << 2);
  return pMVar1;
}

Assistant:

Msat_IntVec_t * Msat_IntVecAllocArrayCopy( int * pArray, int nSize )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = ABC_ALLOC( int, nSize );
    memcpy( p->pArray, pArray, sizeof(int) * nSize );
    return p;
}